

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O0

void __thiscall
tchecker::syncprod::vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t
          (vloc_synchronized_edges_iterator_t *this,
          intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
          *vloc,shared_ptr<const_tchecker::system::loc_edges_maps_t> *loc_edges_maps,
          const_iterator_t *sync_begin,const_iterator_t *sync_end)

{
  const_iterator_t *sync_end_local;
  const_iterator_t *sync_begin_local;
  shared_ptr<const_tchecker::system::loc_edges_maps_t> *loc_edges_maps_local;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
  *vloc_local;
  vloc_synchronized_edges_iterator_t *this_local;
  
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
  intrusive_shared_ptr_t(&this->_vloc,vloc);
  std::shared_ptr<const_tchecker::system::loc_edges_maps_t>::shared_ptr
            (&this->_loc_edges_maps,loc_edges_maps);
  (this->_sync_it)._M_current = sync_begin->_M_current;
  (this->_sync_end)._M_current = sync_end->_M_current;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
  ::cartesian_iterator_t(&this->_cartesian_it);
  advance_while_empty_cartesian_product(this);
  return;
}

Assistant:

vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t(
    tchecker::intrusive_shared_ptr_t<tchecker::shared_vloc_t const> const & vloc,
    std::shared_ptr<tchecker::system::loc_edges_maps_t const> const & loc_edges_maps,
    tchecker::system::synchronizations_t::const_iterator_t const & sync_begin,
    tchecker::system::synchronizations_t::const_iterator_t const & sync_end)
    : _vloc(vloc), _loc_edges_maps(loc_edges_maps), _sync_it(sync_begin), _sync_end(sync_end)
{
  advance_while_empty_cartesian_product();
}